

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_posix::mb2_iconv_converter::mb2_iconv_converter
          (mb2_iconv_converter *this,string *encoding)

{
  undefined1 (*pauVar1) [16];
  pointer puVar2;
  undefined1 auVar3 [16];
  __shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
  *this_00;
  iconv_t __cd;
  size_t sVar4;
  int *piVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__p;
  runtime_error *this_01;
  uint c;
  int iVar6;
  char ibuf [2];
  size_t outsize;
  size_t insize;
  value_type_conflict3 local_9c;
  char *out;
  uint32_t obuf [2];
  undefined1 local_88 [16];
  pointer local_78;
  string *local_68;
  mb2_iconv_converter *local_60;
  __shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
  *local_58;
  char *in;
  
  (this->super_base_converter)._vptr_base_converter =
       (_func_int **)&PTR__mb2_iconv_converter_001db558;
  (this->first_byte_table_).
  super___shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  local_60 = this;
  std::__cxx11::string::string((string *)&this->encoding_,(string *)encoding);
  *(undefined4 *)&this->to_utf_ = 0xffffffff;
  *(undefined4 *)((long)&this->to_utf_ + 4) = 0xffffffff;
  *(undefined4 *)&this->from_utf_ = 0xffffffff;
  *(undefined4 *)((long)&this->from_utf_ + 4) = 0xffffffff;
  local_88 = (undefined1  [16])0x0;
  local_78 = (pointer)0x0;
  local_68 = &this->encoding_;
  __cd = iconv_open("UTF-32LE",(encoding->_M_dataplus)._M_p);
  if (__cd == (iconv_t)0xffffffffffffffff) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   "Unsupported encoding",encoding);
    runtime_error::runtime_error(this_01,(string *)&in);
    __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  local_58 = (__shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
              *)&this->first_byte_table_;
  iVar6 = 0;
  do {
    if (iVar6 == 0x100) {
      iconv_close(__cd);
      this_00 = local_58;
      __p = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
      (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__p->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      __shared_ptr<std::vector<unsigned_int,std::allocator<unsigned_int>>,(__gnu_cxx::_Lock_policy)2>
      ::reset<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this_00,__p);
      pauVar1 = *(undefined1 (**) [16])this_00;
      puVar2 = *(pointer *)pauVar1[1];
      auVar3 = *pauVar1;
      *(undefined8 *)*pauVar1 = local_88._0_8_;
      *(undefined8 *)(*pauVar1 + 8) = local_88._8_8_;
      *(pointer *)pauVar1[1] = local_78;
      local_88 = auVar3;
      local_78 = puVar2;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      return;
    }
    ibuf[0] = (char)iVar6;
    ibuf[1] = '\0';
    obuf[0] = 0xffffffff;
    obuf[1] = 0xffffffff;
    in = ibuf;
    insize = 2;
    outsize = 8;
    out = (char *)obuf;
    iconv(__cd,&in,&insize,&out,&outsize);
    if (((insize == 0) && (outsize == 0)) && (obuf[1] == 0)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,obuf);
    }
    else {
      in = ibuf;
      insize = 1;
      outsize = 8;
      out = (char *)obuf;
      iconv(__cd,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      sVar4 = iconv(__cd,&in,&insize,&out,&outsize);
      if (sVar4 == 0xffffffffffffffff) {
        piVar5 = __errno_location();
        local_9c = 0xfffffffe;
        if (*piVar5 != 0x16) goto LAB_0019fa16;
      }
      else {
LAB_0019fa16:
        local_9c = 0xffffffff;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,&local_9c);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

mb2_iconv_converter(std::string const &encoding) :
            encoding_(encoding),
            to_utf_((iconv_t)(-1)),
            from_utf_((iconv_t)(-1))
        {
            iconv_t d = (iconv_t)(-1);
            std::vector<uint32_t> first_byte_table;
            try {
                d = iconv_open(utf32_encoding(),encoding.c_str());
                if(d == (iconv_t)(-1)) {
                    throw booster::runtime_error("Unsupported encoding" + encoding);
                }
                for(unsigned c=0;c<256;c++) {
                    char ibuf[2] = { char(c) , 0 };
                    char *in = ibuf;
                    size_t insize =2;
                    uint32_t obuf[2] = {illegal,illegal};
                    char *out = reinterpret_cast<char *>(obuf);
                    size_t outsize = 8;
                    // Basic sigle codepoint conversion
                    call_iconv(d,&in,&insize,&out,&outsize);
                    if(insize == 0 && outsize == 0 && obuf[1] == 0) {
                        first_byte_table.push_back(obuf[0]);
                        continue;
                    }
                    
                    // Test if this is illegal first byte or incomplete
                    in = ibuf;
                    insize = 1;
                    out = reinterpret_cast<char *>(obuf);
                    outsize = 8;
                    call_iconv(d,0,0,0,0);
                    size_t res = call_iconv(d,&in,&insize,&out,&outsize);
                    
                    // Now if this single byte starts a sequence we add incomplete 
                    // to know to ask that we need two bytes, othewise it may only be
                    // illegal

                    uint32_t point;
                    if(res == (size_t)(-1) && errno == EINVAL)
                        point = incomplete;
                    else
                        point = illegal;
                    first_byte_table.push_back(point);

                }
            }
            catch(...) {
                if(d!=(iconv_t)(-1))
                    iconv_close(d);
                throw;
            }
            iconv_close(d);
            first_byte_table_.reset(new std::vector<uint32_t>());
            first_byte_table_->swap(first_byte_table);
        }